

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_tracer.cc
# Opt level: O0

bool rtc::tracing::StartInternalCapture(char *filename)

{
  bool bVar1;
  ostream *poVar2;
  LogMessage local_1e8;
  LogMessageVoidify local_21;
  FILE *local_20;
  FILE *file;
  char *filename_local;
  
  file = (FILE *)filename;
  local_20 = fopen(filename,"w");
  if (local_20 == (FILE *)0x0) {
    bVar1 = LogMessage::Loggable(LERROR);
    if (bVar1) {
      LogMessageVoidify::LogMessageVoidify(&local_21);
      LogMessage::LogMessage
                (&local_1e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/base/event_tracer.cc"
                 ,0xfa,LERROR,ERRCTX_NONE,0,(char *)0x0);
      poVar2 = LogMessage::stream(&local_1e8);
      poVar2 = std::operator<<(poVar2,"Failed to open trace file \'");
      poVar2 = std::operator<<(poVar2,(char *)file);
      poVar2 = std::operator<<(poVar2,"\' for writing.");
      LogMessageVoidify::operator&(&local_21,poVar2);
      LogMessage::~LogMessage(&local_1e8);
    }
    filename_local._7_1_ = false;
  }
  else {
    anon_unknown_0::EventLogger::Start((anonymous_namespace)::g_event_logger,(FILE *)local_20,true);
    filename_local._7_1_ = true;
  }
  return filename_local._7_1_;
}

Assistant:

bool StartInternalCapture(const char* filename) {
  FILE* file = fopen(filename, "w");
  if (!file) {
    LOG(LS_ERROR) << "Failed to open trace file '" << filename
                  << "' for writing.";
    return false;
  }
  g_event_logger->Start(file, true);
  return true;
}